

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * parse_value(char **string,size_t nesting)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  JSON_Status JVar5;
  ushort **ppuVar6;
  int *piVar7;
  JSON_Value *pJVar8;
  byte *pbVar9;
  char *pcVar10;
  size_t sVar11;
  JSON_Value *value;
  ushort *puVar12;
  ulong uVar13;
  size_t sVar14;
  byte *pbVar15;
  JSON_Array *array;
  long lVar16;
  double number;
  size_t new_string_len;
  JSON_Object *local_38;
  
  if (0x800 < nesting) {
    return (JSON_Value *)0x0;
  }
  ppuVar6 = __ctype_b_loc();
  pbVar15 = (byte *)*string;
  while (bVar1 = *pbVar15, (*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 0x20) != 0) {
    pbVar15 = pbVar15 + 1;
    *string = (char *)pbVar15;
  }
  if (9 < bVar1 - 0x30) {
    if (bVar1 == 0x22) {
      new_string_len = 0;
      pcVar10 = get_quoted_string(string,&new_string_len);
      if (pcVar10 == (char *)0x0) {
        return (JSON_Value *)0x0;
      }
      pJVar8 = json_value_init_string_no_copy(pcVar10,new_string_len);
      if (pJVar8 == (JSON_Value *)0x0) {
        (*parson_free)(pcVar10);
        return (JSON_Value *)0x0;
      }
      return pJVar8;
    }
    if (bVar1 != 0x2d) {
      if (bVar1 == 0x5b) {
        pJVar8 = json_value_init_array();
        if (pJVar8 == (JSON_Value *)0x0) {
          return (JSON_Value *)0x0;
        }
        if (**string == '[') {
          if (pJVar8->type == 5) {
            array = (pJVar8->value).array;
          }
          else {
            array = (JSON_Array *)0x0;
          }
          pbVar15 = (byte *)(*string + 1);
          do {
            *string = (char *)pbVar15;
            puVar12 = *ppuVar6;
            bVar1 = *pbVar15;
            uVar13 = (ulong)bVar1;
            pbVar15 = pbVar15 + 1;
          } while ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) != 0);
          if (bVar1 == 0x5d) goto LAB_0016d1ce;
          while (pbVar9 = pbVar15 + -1, (char)uVar13 != '\0') {
            value = parse_value(string,nesting + 1);
            if (value == (JSON_Value *)0x0) goto LAB_0016d2c6;
            JVar5 = json_array_add(array,value);
            if (JVar5 != 0) goto LAB_0016d28c;
            pbVar9 = (byte *)*string;
            pbVar15 = pbVar9;
            while( true ) {
              pbVar15 = pbVar15 + 1;
              puVar12 = *ppuVar6;
              uVar13 = (ulong)*pbVar9;
              if ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) == 0) break;
              pbVar9 = pbVar9 + 1;
              *string = (char *)pbVar9;
            }
            if (*pbVar9 != 0x2c) goto LAB_0016d258;
            do {
              *string = (char *)pbVar15;
              puVar12 = *ppuVar6;
              uVar13 = (ulong)*pbVar15;
              pbVar15 = pbVar15 + 1;
            } while ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) != 0);
          }
          uVar13 = 0;
LAB_0016d258:
          while( true ) {
            pbVar9 = pbVar9 + 1;
            if ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) == 0) break;
            *string = (char *)pbVar9;
            puVar12 = *ppuVar6;
            uVar13 = (ulong)*pbVar9;
          }
          if ((char)uVar13 == ']') {
            if (array == (JSON_Array *)0x0) {
              sVar14 = 0;
            }
            else {
              sVar14 = array->count;
            }
            JVar5 = json_array_resize(array,sVar14);
            if (JVar5 == 0) {
              *string = *string + 1;
              return pJVar8;
            }
          }
        }
        goto LAB_0016d2c6;
      }
      if (bVar1 != 0x66) {
        if (bVar1 == 0x6e) {
          iVar3 = strncmp("null",(char *)pbVar15,4);
          if (iVar3 != 0) {
            return (JSON_Value *)0x0;
          }
          *string = (char *)(pbVar15 + 4);
          pJVar8 = json_value_init_null();
          return pJVar8;
        }
        if (bVar1 != 0x74) {
          if (bVar1 != 0x7b) {
            return (JSON_Value *)0x0;
          }
          pJVar8 = json_value_init_object();
          if (pJVar8 == (JSON_Value *)0x0) {
            return (JSON_Value *)0x0;
          }
          if (**string != '{') {
LAB_0016d2c6:
            json_value_free(pJVar8);
            return (JSON_Value *)0x0;
          }
          if (pJVar8->type == 4) {
            local_38 = (JSON_Object *)(pJVar8->value).string.chars;
          }
          else {
            local_38 = (JSON_Object *)0x0;
          }
          pbVar9 = (byte *)(*string + 1);
          do {
            *string = (char *)pbVar9;
            puVar12 = *ppuVar6;
            bVar1 = *pbVar9;
            uVar13 = (ulong)bVar1;
            pbVar9 = pbVar9 + 1;
          } while ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) != 0);
          pbVar15 = pbVar9;
          if (bVar1 != 0x7d) {
            while (pbVar15 = pbVar9 + -1, (char)uVar13 != '\0') {
              new_string_len = 0;
              pcVar10 = get_quoted_string(string,&new_string_len);
              sVar14 = new_string_len;
              if (pcVar10 == (char *)0x0) goto LAB_0016d2c6;
              sVar11 = strlen(pcVar10);
              if (sVar14 != sVar11) {
LAB_0016d23d:
                (*parson_free)(pcVar10);
                goto LAB_0016d2c6;
              }
              pbVar15 = (byte *)*string;
              while( true ) {
                pbVar9 = pbVar15 + 1;
                if ((*(byte *)((long)*ppuVar6 + (ulong)*pbVar15 * 2 + 1) & 0x20) == 0) break;
                *string = (char *)pbVar9;
                pbVar15 = pbVar9;
              }
              if (*pbVar15 != 0x3a) goto LAB_0016d23d;
              *string = (char *)pbVar9;
              value = parse_value(string,nesting + 1);
              if (value == (JSON_Value *)0x0) goto LAB_0016d23d;
              JVar5 = json_object_add(local_38,pcVar10,value);
              if (JVar5 != 0) {
                (*parson_free)(pcVar10);
LAB_0016d28c:
                json_value_free(value);
                goto LAB_0016d2c6;
              }
              pbVar15 = (byte *)*string;
              pbVar9 = pbVar15;
              while( true ) {
                pbVar9 = pbVar9 + 1;
                puVar12 = *ppuVar6;
                uVar13 = (ulong)*pbVar15;
                if ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) == 0) break;
                pbVar15 = pbVar15 + 1;
                *string = (char *)pbVar15;
              }
              if (*pbVar15 != 0x2c) goto LAB_0016d2a0;
              do {
                *string = (char *)pbVar9;
                puVar12 = *ppuVar6;
                uVar13 = (ulong)*pbVar9;
                pbVar9 = pbVar9 + 1;
              } while ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) != 0);
            }
            uVar13 = 0;
LAB_0016d2a0:
            while( true ) {
              pbVar15 = pbVar15 + 1;
              if ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) == 0) break;
              *string = (char *)pbVar15;
              puVar12 = *ppuVar6;
              uVar13 = (ulong)*pbVar15;
            }
            if ((char)uVar13 != '}') goto LAB_0016d2c6;
          }
LAB_0016d1ce:
          *string = (char *)pbVar15;
          return pJVar8;
        }
      }
      lVar16 = 4;
      iVar3 = strncmp("true",(char *)pbVar15,4);
      if (iVar3 == 0) {
        iVar3 = 1;
      }
      else {
        lVar16 = 5;
        iVar4 = strncmp("false",(char *)pbVar15,5);
        iVar3 = 0;
        if (iVar4 != 0) {
          return (JSON_Value *)0x0;
        }
      }
      *string = (char *)(pbVar15 + lVar16);
      pJVar8 = json_value_init_boolean(iVar3);
      return pJVar8;
    }
  }
  piVar7 = __errno_location();
  *piVar7 = 0;
  number = strtod((char *)pbVar15,(char **)&new_string_len);
  iVar3 = *piVar7;
  if (iVar3 == 0x22 && ABS(number) == INFINITY) {
    return (JSON_Value *)0x0;
  }
  if ((iVar3 != 0x22) && (iVar3 != 0)) {
    return (JSON_Value *)0x0;
  }
  pcVar10 = *string;
  uVar13 = new_string_len - (long)pcVar10;
  if (1 < uVar13) {
    if (*pcVar10 == '0') {
      cVar2 = pcVar10[1];
    }
    else {
      if ((*pcVar10 != '-' || uVar13 == 2) || (pcVar10[1] != '0')) goto LAB_0016d055;
      cVar2 = pcVar10[2];
    }
    if (cVar2 != '.') {
      return (JSON_Value *)0x0;
    }
  }
LAB_0016d055:
  do {
    if (uVar13 == 0) {
      *string = (char *)new_string_len;
      pJVar8 = json_value_init_number(number);
      return pJVar8;
    }
    cVar2 = pcVar10[uVar13 - 1];
  } while (((cVar2 != '\0') && (cVar2 != 'X')) && (uVar13 = uVar13 - 1, cVar2 != 'x'));
  return (JSON_Value *)0x0;
}

Assistant:

static JSON_Value * parse_value(const char **string, size_t nesting) {
    if (nesting > MAX_NESTING) {
        return NULL;
    }
    SKIP_WHITESPACES(string);
    switch (**string) {
        case '{':
            return parse_object_value(string, nesting + 1);
        case '[':
            return parse_array_value(string, nesting + 1);
        case '\"':
            return parse_string_value(string);
        case 'f': case 't':
            return parse_boolean_value(string);
        case '-':
        case '0': case '1': case '2': case '3': case '4':
        case '5': case '6': case '7': case '8': case '9':
            return parse_number_value(string);
        case 'n':
            return parse_null_value(string);
        default:
            return NULL;
    }
}